

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::ResolveTexture
          (BlenderImporter *this,aiMaterial *out,Material *mat,MTex *tex,ConversionData *conv_data)

{
  Type TVar1;
  ConversionData *tex_00;
  MTex *mat_00;
  Material *out_00;
  bool bVar2;
  element_type *img;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  format local_1b8;
  char *local_40;
  char *dispnam;
  Tex *rtex;
  ConversionData *conv_data_local;
  MTex *tex_local;
  Material *mat_local;
  aiMaterial *out_local;
  BlenderImporter *this_local;
  
  rtex = (Tex *)conv_data;
  conv_data_local = (ConversionData *)tex;
  tex_local = (MTex *)mat;
  mat_local = (Material *)out;
  out_local = (aiMaterial *)this;
  dispnam = (char *)std::__shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>::get
                              (&(tex->tex).
                                super___shared_ptr<Assimp::Blender::Tex,_(__gnu_cxx::_Lock_policy)2>
                              );
  if (((element_type *)dispnam != (element_type *)0x0) && (((element_type *)dispnam)->type != 0)) {
    local_40 = "";
    TVar1 = ((element_type *)dispnam)->type;
    if (6 < TVar1 - Type_CLOUDS) {
      if (TVar1 == Type_IMAGE) {
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)&((element_type *)dispnam)->ima);
        out_00 = mat_local;
        mat_00 = tex_local;
        tex_00 = conv_data_local;
        if (!bVar2) {
          LogFunctions<Assimp::BlenderImporter>::LogError
                    ("A texture claims to be an Image, but no image reference is given");
          return;
        }
        img = std::__shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2> *)
                         (dispnam + 0x430));
        ResolveImage(this,(aiMaterial *)out_00,(Material *)mat_00,(MTex *)tex_00,img,
                     (ConversionData *)rtex);
        return;
      }
      if (6 < TVar1 - Type_PLUGIN) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Blender/BlenderLoader.cpp"
                      ,0x22d,
                      "void Assimp::BlenderImporter::ResolveTexture(aiMaterial *, const Material *, const MTex *, ConversionData &)"
                     );
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"Encountered a texture with an unsupported type: ",&local_1f9);
    std::operator+(&local_1d8,&local_1f8,local_40);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1b8,
               &local_1d8);
    LogFunctions<Assimp::BlenderImporter>::LogWarn(&local_1b8);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    AddSentinelTexture(this,(aiMaterial *)mat_local,(Material *)tex_local,(MTex *)conv_data_local,
                       (ConversionData *)rtex);
  }
  return;
}

Assistant:

void BlenderImporter::ResolveTexture(aiMaterial* out, const Material* mat, const MTex* tex, ConversionData& conv_data)
{
    const Tex* rtex = tex->tex.get();
    if(!rtex || !rtex->type) {
        return;
    }

    // We can't support most of the texture types because they're mostly procedural.
    // These are substituted by a dummy texture.
    const char* dispnam = "";
    switch( rtex->type )
    {
            // these are listed in blender's UI
        case Tex::Type_CLOUDS       :
        case Tex::Type_WOOD         :
        case Tex::Type_MARBLE       :
        case Tex::Type_MAGIC        :
        case Tex::Type_BLEND        :
        case Tex::Type_STUCCI       :
        case Tex::Type_NOISE        :
        case Tex::Type_PLUGIN       :
        case Tex::Type_MUSGRAVE     :
        case Tex::Type_VORONOI      :
        case Tex::Type_DISTNOISE    :
        case Tex::Type_ENVMAP       :

            // these do no appear in the UI, why?
        case Tex::Type_POINTDENSITY :
        case Tex::Type_VOXELDATA    :

            LogWarn(std::string("Encountered a texture with an unsupported type: ")+dispnam);
            AddSentinelTexture(out, mat, tex, conv_data);
            break;

        case Tex::Type_IMAGE        :
            if (!rtex->ima) {
                LogError("A texture claims to be an Image, but no image reference is given");
                break;
            }
            ResolveImage(out, mat, tex, rtex->ima.get(),conv_data);
            break;

        default:
            ai_assert(false);
    };
}